

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_write_compressed_img
              (fitsfile *fptr,int datatype,long *infpixel,long *inlpixel,int nullcheck,void *array,
              void *nullval,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long row;
  long lVar17;
  long lVar18;
  long lVar19;
  char *bnullarray;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  uint local_3fc;
  long local_250;
  long local_248;
  int tstatus;
  int tilenul;
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long lpixel [6];
  long fpixel [6];
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = fits_is_compressed_image(fptr,status);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
    *status = 0x19d;
    return 0x19d;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart != -1) || (iVar2 = ffrdef(fptr,status), iVar2 < 1))
    goto LAB_001ca4ac;
LAB_001cae3b:
    iVar2 = *status;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
LAB_001ca4ac:
    uVar16 = datatype & 0xfffffffe;
    uVar12 = 2;
    uVar3 = 4;
    if (uVar16 == 0x14) {
      local_3fc = 2;
LAB_001ca51b:
      pFVar1 = fptr->Fptr;
      uVar11 = (ulong)(uint)pFVar1->compress_type;
      if (uVar11 < 0x34) {
        if ((0x8000000600800U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 != 0x1f) {
            if (uVar11 != 0x29) goto LAB_001cae90;
            if (pFVar1->zbitpix != 8) {
              uVar16 = uVar3;
              if (pFVar1->zbitpix != 0x10) {
                uVar16 = 8;
              }
              goto LAB_001ca582;
            }
          }
LAB_001ca580:
          uVar16 = uVar3;
        }
        else {
          uVar16 = local_3fc;
          if ((pFVar1->zbitpix != 8) && (uVar16 = uVar12, pFVar1->zbitpix != 0x10))
          goto LAB_001ca580;
        }
LAB_001ca582:
        pcVar4 = (char *)calloc(pFVar1->maxtilelen,(ulong)uVar16);
        if (pcVar4 == (char *)0x0) {
          ffpmsg("Out of memory (fits_write_compress_img)");
          *status = 0x71;
          return 0x71;
        }
        lVar5 = 0;
        do {
          naxis[lVar5] = 1;
          tilesize[lVar5] = 1;
          ftile[lVar5] = 1;
          ltile[lVar5] = 1;
          rowdim[lVar5] = 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 6);
        uVar3 = pFVar1->zndim;
        if (0 < (long)(int)uVar3) {
          lVar5 = 1;
          lVar21 = 0;
          do {
            lVar6 = *(long *)((long)infpixel + lVar21);
            *(long *)((long)fpixel + lVar21) = lVar6;
            lVar13 = *(long *)((long)inlpixel + lVar21);
            *(long *)((long)lpixel + lVar21) = lVar13;
            lVar17 = *(long *)((long)pFVar1->znaxis + lVar21);
            *(long *)((long)naxis + lVar21) = lVar17;
            if (lVar6 < 1) {
              free(pcVar4);
              *status = 0x141;
              return 0x141;
            }
            lVar7 = *(long *)((long)pFVar1->tilesize + lVar21);
            *(long *)((long)tilesize + lVar21) = lVar7;
            *(long *)((long)ftile + lVar21) = (lVar6 + -1) / lVar7 + 1;
            lVar6 = (lVar13 + -1) / lVar7 + 1;
            lVar13 = (long)((int)((lVar17 + -1) / lVar7) + 1);
            if (lVar13 <= lVar6) {
              lVar6 = lVar13;
            }
            *(long *)((long)ltile + lVar21) = lVar6;
            *(long *)((long)rowdim + lVar21) = lVar5;
            lVar5 = lVar5 * lVar13;
            lVar21 = lVar21 + 8;
          } while ((long)(int)uVar3 * 8 - lVar21 != 0);
        }
        if (ftile[5] <= ltile[5]) {
          lVar5 = ftile[5];
          do {
            lVar21 = tilesize[5] * (lVar5 + -1);
            tlpixel[5] = tilesize[5] * lVar5;
            if (naxis[5] <= tilesize[5] * lVar5) {
              tlpixel[5] = naxis[5];
            }
            tfpixel[5] = lVar21 + 1;
            if (ftile[4] <= ltile[4]) {
              lVar21 = tlpixel[5] - lVar21;
              lVar6 = ftile[4];
              do {
                lVar13 = tilesize[4] * (lVar6 + -1);
                tlpixel[4] = tilesize[4] * lVar6;
                if (naxis[4] <= tilesize[4] * lVar6) {
                  tlpixel[4] = naxis[4];
                }
                tfpixel[4] = lVar13 + 1;
                if (ftile[3] <= ltile[3]) {
                  lVar13 = tlpixel[4] - lVar13;
                  lVar17 = ftile[3];
                  do {
                    lVar7 = tilesize[3] * (lVar17 + -1);
                    tlpixel[3] = tilesize[3] * lVar17;
                    if (naxis[3] <= tilesize[3] * lVar17) {
                      tlpixel[3] = naxis[3];
                    }
                    tfpixel[3] = lVar7 + 1;
                    if (ftile[2] <= ltile[2]) {
                      lVar7 = tlpixel[3] - lVar7;
                      lVar18 = ftile[2];
                      do {
                        lVar8 = tilesize[2] * (lVar18 + -1);
                        tlpixel[2] = tilesize[2] * lVar18;
                        if (naxis[2] <= tilesize[2] * lVar18) {
                          tlpixel[2] = naxis[2];
                        }
                        tfpixel[2] = lVar8 + 1;
                        if (ftile[1] <= ltile[1]) {
                          lVar8 = tlpixel[2] - lVar8;
                          lVar22 = ftile[1];
                          do {
                            lVar9 = tilesize[1] * (lVar22 + -1);
                            tlpixel[1] = tilesize[1] * lVar22;
                            if (naxis[1] <= tilesize[1] * lVar22) {
                              tlpixel[1] = naxis[1];
                            }
                            tfpixel[1] = lVar9 + 1;
                            if (ftile[0] <= ltile[0]) {
                              lVar9 = tlpixel[1] - lVar9;
                              lVar19 = ftile[0];
                              do {
                                lVar10 = (lVar19 + -1) * tilesize[0];
                                tfpixel[0] = lVar10 + 1;
                                tlpixel[0] = tilesize[0] * lVar19;
                                if (naxis[0] <= tilesize[0] * lVar19) {
                                  tlpixel[0] = naxis[0];
                                }
                                lVar10 = (tlpixel[0] - lVar10) *
                                         lVar9 * lVar8 * lVar7 * lVar13 * lVar21;
                                row = (lVar22 + -1) * rowdim[1] +
                                      (lVar18 + -1) * rowdim[2] +
                                      (lVar17 + -1) * rowdim[3] +
                                      (lVar6 + -1) * rowdim[4] + (lVar5 + -1) * rowdim[5] + lVar19;
                                iVar2 = 0;
                                bnullarray = (char *)nullval;
                                imcomp_decompress_tile
                                          (fptr,(int)row,(int)lVar10,datatype,nullcheck,nullval,
                                           pcVar4,(char *)0x0,&tilenul,status);
                                if (*status == 0x19f) {
                                  memset(pcVar4,0,lVar10 * (ulong)local_3fc);
                                  *status = 0;
                                }
                                imcomp_merge_overlap
                                          (pcVar4,local_3fc,uVar3,tfpixel,tlpixel,bnullarray,
                                           (char *)array,fpixel,lpixel,iVar2,status);
                                if (*status == 0) {
                                  if ((int)uVar3 < 1) {
                                    local_248 = 1;
                                    lVar20 = 0;
                                  }
                                  else {
                                    local_248 = 1;
                                    lVar20 = 0;
                                    uVar11 = 0;
                                    do {
                                      lVar14 = tlpixel[uVar11] - tfpixel[uVar11];
                                      if (lVar14 != 0 && tfpixel[uVar11] <= tlpixel[uVar11]) {
                                        lVar14 = lVar14 + 1;
                                        lVar15 = lVar14;
                                        if (lVar20 == 0) {
                                          lVar15 = 1;
                                          lVar20 = lVar14;
                                        }
                                        local_248 = local_248 * lVar15;
                                      }
                                      uVar11 = uVar11 + 1;
                                    } while (uVar3 != uVar11);
                                  }
                                  local_250 = lVar20 + (ulong)(lVar20 == 0);
                                }
                                imcomp_compress_tile
                                          (fptr,row,datatype,pcVar4,lVar10,local_250,local_248,
                                           nullcheck,nullval,status);
                                bVar23 = lVar19 != ltile[0];
                                lVar19 = lVar19 + 1;
                              } while (bVar23);
                            }
                            bVar23 = lVar22 != ltile[1];
                            lVar22 = lVar22 + 1;
                          } while (bVar23);
                        }
                        bVar23 = lVar18 != ltile[2];
                        lVar18 = lVar18 + 1;
                      } while (bVar23);
                    }
                    bVar23 = lVar17 != ltile[3];
                    lVar17 = lVar17 + 1;
                  } while (bVar23);
                }
                bVar23 = lVar6 != ltile[4];
                lVar6 = lVar6 + 1;
              } while (bVar23);
            }
            bVar23 = lVar5 != ltile[5];
            lVar5 = lVar5 + 1;
          } while (bVar23);
        }
        free(pcVar4);
        if ((nullcheck != 0) && (fptr->Fptr->zbitpix < 0)) {
          tstatus = 0;
          ffgcrd(fptr,"ZBLANK",card,&tstatus);
          if (tstatus != 0) {
            ffgcrd(fptr,"ZCMPTYPE",card,status);
            ffikyj(fptr,"ZBLANK",-0x7fffffff,"null value in the compressed integer array",status);
            pFVar1 = fptr->Fptr;
            pFVar1->zblank = -0x7fffffff;
            pFVar1->cn_zblank = -1;
          }
        }
        goto LAB_001cae3b;
      }
LAB_001cae90:
      pcVar4 = "unsupported image compression algorithm";
    }
    else {
      if (uVar16 == 0x1e) {
LAB_001ca4c6:
        uVar3 = 4;
        uVar12 = 4;
        local_3fc = 4;
        goto LAB_001ca51b;
      }
      local_3fc = 1;
      if (datatype - 0xbU < 2) goto LAB_001ca51b;
      uVar3 = 8;
      if (uVar16 == 0x28) {
LAB_001ca50e:
        uVar12 = 8;
        local_3fc = 8;
        goto LAB_001ca51b;
      }
      if (datatype == 0x2a) goto LAB_001ca4c6;
      if (datatype == 0x52) goto LAB_001ca50e;
      pcVar4 = "unsupported datatype for compressing image";
    }
    ffpmsg(pcVar4);
    *status = 0x19a;
    iVar2 = 0x19a;
  }
  return iVar2;
}

Assistant:

int fits_write_compressed_img(fitsfile *fptr,   /* I - FITS file pointer     */
            int  datatype,   /* I - datatype of the array to be written      */
            long  *infpixel, /* I - 'bottom left corner' of the subsection   */
            long  *inlpixel, /* I - 'top right corner' of the subsection     */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,     /* I - array of values to be written            */
            void *nullval,   /* I - undefined pixel value                    */
            int  *status)    /* IO - error status                            */
/*
   Write a section of a compressed image.
*/
{
    int  tiledim[MAX_COMPRESS_DIM];
    long naxis[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow, trowsize, ntrows;
    int ii, ndim, pixlen, tilenul;
    int  tstatus, buffpixsiz;
    void *buffer;
    char *bnullarray = 0, card[FLEN_CARD];

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);


    /* ===================================================================== */


    if (datatype == TSHORT || datatype == TUSHORT)
    {
       pixlen = sizeof(short);
    }
    else if (datatype == TINT || datatype == TUINT)
    {
       pixlen = sizeof(int);
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       pixlen = 1;
    }
    else if (datatype == TLONG || datatype == TULONG)
    {
       pixlen = sizeof(long);
    }
    else if (datatype == TFLOAT)
    {
       pixlen = sizeof(float);
    }
    else if (datatype == TDOUBLE)
    {
       pixlen = sizeof(double);
    }
    else
    {
        ffpmsg("unsupported datatype for compressing image");
        return(*status = BAD_DATATYPE);
    }

    /* ===================================================================== */

    /* allocate scratch space for processing one tile of the image */
    buffpixsiz = pixlen;  /* this is the minimum pixel size */
    
    if ( (fptr->Fptr)->compress_type == HCOMPRESS_1) { /* need 4 or 8 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG ||
	    (fptr->Fptr)->zbitpix == SHORT_IMG )
                buffpixsiz = maxvalue(buffpixsiz, 4);
        else
	        buffpixsiz = 8;
    }
    else if ( (fptr->Fptr)->compress_type == PLIO_1) { /* need 4 bytes per pixel */
                buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else if ( (fptr->Fptr)->compress_type == RICE_1  ||
              (fptr->Fptr)->compress_type == GZIP_1 ||
              (fptr->Fptr)->compress_type == GZIP_2 ||
              (fptr->Fptr)->compress_type == BZIP2_1) {  /* need 1, 2, or 4 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 1);
        else if ((fptr->Fptr)->zbitpix == SHORT_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 2);
        else 
            buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else
    {
        ffpmsg("unsupported image compression algorithm");
        return(*status = BAD_DATATYPE);
    }
    
    /* cast to double to force alignment on 8-byte addresses */
    buffer = (double *) calloc ((fptr->Fptr)->maxtilelen, buffpixsiz);

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_write_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }

    /* ===================================================================== */

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        fpixel[ii] = infpixel[ii];
        lpixel[ii] = inlpixel[ii];

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
              tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
              tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

              /* read and uncompress this row (tile) of the table */
              /* also do type conversion and undefined pixel substitution */
              /* at this point */
              imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

              if (*status == NO_COMPRESSED_TILE)
              {
                   /* tile doesn't exist, so initialize to zero */
                   memset(buffer, 0, pixlen * thistilesize[0]);
                   *status = 0;
              }

              /* copy the intersecting pixels to this tile from the input */
              imcomp_merge_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, nullcheck, status);
                     
             /* Collapse sizes of higher dimension tiles into 2 dimensional
                equivalents needed by the quantizing algorithms for
                floating point types */
              fits_calc_tile_rows(tlpixel, tfpixel, ndim, &trowsize,
                              &ntrows, status);

              /* compress the tile again, and write it back to the FITS file */
              imcomp_compress_tile (fptr, irow, datatype, buffer, 
                                    thistilesize[0],
				    trowsize,
				    ntrows,
				    nullcheck, nullval, 
				    status);
            }
          }
        }
      }
     }
    }
    free(buffer);
    

    if ((fptr->Fptr)->zbitpix < 0 && nullcheck != 0) { 
/*
     This is a floating point FITS image with possible null values.
     It is too messy to test if any null values are actually written, so 
     just assume so.  We need to make sure that the
     ZBLANK keyword is present in the compressed image header.  If it is not
     there then we need to insert the keyword. 
*/   
        tstatus = 0;
        ffgcrd(fptr, "ZBLANK", card, &tstatus);

	if (tstatus) {   /* have to insert the ZBLANK keyword */
           ffgcrd(fptr, "ZCMPTYPE", card, status);
           ffikyj(fptr, "ZBLANK", COMPRESS_NULL_VALUE, 
                "null value in the compressed integer array", status);
	
           /* set this value into the internal structure; it is used if */
	   /* the program reads back the values from the array */
	 
          (fptr->Fptr)->zblank = COMPRESS_NULL_VALUE;
          (fptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }  
    }  
    
    return(*status);
}